

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunctionType.cpp
# Opt level: O1

void __thiscall
Js::ScriptFunctionType::ChangeEntryPoint
          (ScriptFunctionType *this,ProxyEntryPointInfo *entryPointInfo,JavascriptMethod entryPoint,
          bool isAsmJS)

{
  JavascriptMethod thunk;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *pp_Var4;
  
  if (entryPoint == (JavascriptMethod)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ScriptFunctionType.cpp"
                                ,0x31,"(entryPoint != nullptr)","entryPoint != nullptr");
    if (!bVar2) goto LAB_00de1a93;
    *puVar3 = 0;
  }
  if (entryPointInfo == (ProxyEntryPointInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ScriptFunctionType.cpp"
                                ,0x32,"(entryPointInfo != nullptr)","entryPointInfo != nullptr");
    if (!bVar2) {
LAB_00de1a93:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  thunk = (JavascriptMethod)(this->super_DynamicType).super_Type.entryPoint;
  if ((thunk == entryPoint) && ((this->entryPointInfo).ptr == entryPointInfo)) {
    return;
  }
  if (isAsmJS) {
    pp_Var4 = &entryPointInfo->jsMethod;
  }
  else {
    bVar2 = CrossSite::IsThunk(thunk);
    if (bVar2) goto LAB_00de1a61;
    pp_Var4 = &(this->super_DynamicType).super_Type.entryPoint;
  }
  *pp_Var4 = (Type)entryPoint;
LAB_00de1a61:
  ScriptFunction::CopyEntryPointInfoToThreadContextIfNecessary
            ((this->entryPointInfo).ptr,entryPointInfo);
  Memory::Recycler::WBSetBit((char *)&this->entryPointInfo);
  (this->entryPointInfo).ptr = entryPointInfo;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entryPointInfo);
  return;
}

Assistant:

void ScriptFunctionType::ChangeEntryPoint(ProxyEntryPointInfo * entryPointInfo, JavascriptMethod entryPoint, bool isAsmJS)
    {
        Assert(entryPoint != nullptr);
        Assert(entryPointInfo != nullptr);
        if (this->GetEntryPoint() == entryPoint && this->GetEntryPointInfo() == entryPointInfo)
        {
            return;
        }

        // ASMJS:- for asmjs we don't need to update the entry point here as it updates the types entry point
        if (!isAsmJS)
        {
            // We can't go from cross-site to non-cross-site. Update only in the non-cross site case
            if (!CrossSite::IsThunk(this->GetEntryPoint()))
            {
                this->SetEntryPoint(entryPoint);
            }
        }
        // instead update the address in the function entrypoint info
        else
        {
            entryPointInfo->jsMethod = entryPoint;
        }

        ProxyEntryPointInfo* oldEntryPointInfo = this->GetEntryPointInfo();
        ScriptFunction::CopyEntryPointInfoToThreadContextIfNecessary(oldEntryPointInfo, entryPointInfo);

        this->SetEntryPointInfo(entryPointInfo);
    }